

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

uint Catch::rngSeed(void)

{
  uint uVar1;
  undefined8 *puVar2;
  
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_00183a80;
    IMutableContext::currentContext[1] = (long)&PTR__Context_00183ad0;
  }
  puVar2 = (undefined8 *)(**(code **)(*IMutableContext::currentContext + 0x20))();
  uVar1 = (**(code **)(*(long *)*puVar2 + 0x88))();
  return uVar1;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }